

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

uint64_t bfy_buffer_remove_ntoh_u64(bfy_buffer *buf)

{
  size_t sVar1;
  int *piVar2;
  size_t len;
  uint64_t val;
  bfy_buffer *buf_local;
  
  len = 0;
  val = (uint64_t)buf;
  sVar1 = bfy_buffer_remove(buf,8,&len);
  if (sVar1 == 8) {
    len = len >> 0x38 | (len & 0xff000000000000) >> 0x28 | (len & 0xff0000000000) >> 0x18 |
          (len & 0xff00000000) >> 8 | (len & 0xff000000) << 8 | (len & 0xff0000) << 0x18 |
          (len & 0xff00) << 0x28 | len << 0x38;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x2a;
  }
  return len;
}

Assistant:

uint64_t
bfy_buffer_remove_ntoh_u64(struct bfy_buffer* buf) {
    uint64_t val = 0;
    size_t const len = bfy_buffer_remove(buf, sizeof(val), &val);
    if (len == sizeof(val)) {
        val = ntoh64(val);
    } else {
        errno = ENOMSG;
    }
    return val;
}